

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_tags.cpp
# Opt level: O1

int __thiscall FLineIdIterator::Next(FLineIdIterator *this)

{
  int iVar1;
  FTagItem *pFVar2;
  uint uVar3;
  
  pFVar2 = tagManager.allIDs.Array;
  uVar3 = this->start;
  if (-1 < (int)uVar3) {
    do {
      if (pFVar2[uVar3].tag == this->searchtag) break;
      uVar3 = pFVar2[uVar3].nexttag;
      this->start = uVar3;
    } while (-1 < (int)uVar3);
  }
  if (uVar3 != 0xffffffff) {
    iVar1 = tagManager.allIDs.Array[(int)uVar3].target;
    this->start = tagManager.allIDs.Array[(int)uVar3].nexttag;
    return iVar1;
  }
  return -1;
}

Assistant:

int FLineIdIterator::Next()
{
	while (start >= 0 && tagManager.allIDs[start].tag != searchtag) start = tagManager.allIDs[start].nexttag;
	if (start == -1) return -1;
	int ret = tagManager.allIDs[start].target;
	start = tagManager.allIDs[start].nexttag;
	return ret;
}